

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  int v;
  int base_local;
  expdesc *var_local;
  TString *n_local;
  FuncState *fs_local;
  
  if (fs == (FuncState *)0x0) {
    init_exp(var,VGLOBAL,0xff);
    fs_local._4_4_ = 8;
  }
  else {
    iVar1 = searchvar(fs,n);
    if (iVar1 < 0) {
      iVar1 = singlevaraux(fs->prev,n,var,0);
      if (iVar1 == 8) {
        fs_local._4_4_ = 8;
      }
      else {
        iVar1 = indexupvalue(fs,n,var);
        (var->u).s.info = iVar1;
        var->k = VUPVAL;
        fs_local._4_4_ = 7;
      }
    }
    else {
      init_exp(var,VLOCAL,iVar1);
      if (base == 0) {
        markupval(fs,iVar1);
      }
      fs_local._4_4_ = 6;
    }
  }
  return fs_local._4_4_;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL) {  /* no more levels? */
    init_exp(var, VGLOBAL, NO_REG);  /* default is global variable */
    return VGLOBAL;
  }
  else {
    int v = searchvar(fs, n);  /* look up at current level */
    if (v >= 0) {
      init_exp(var, VLOCAL, v);
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found at current level; try upper one */
      if (singlevaraux(fs->prev, n, var, 0) == VGLOBAL)
        return VGLOBAL;
      var->u.s.info = indexupvalue(fs, n, var);  /* else was LOCAL or UPVAL */
      var->k = VUPVAL;  /* upvalue in this level */
      return VUPVAL;
    }
  }
}